

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_json.cpp
# Opt level: O2

char * udf_json_get_value(UDF_INIT *initid,UDF_ARGS *args,char *result,unsigned_long *length,
                         char *is_null,char *error)

{
  char *pcVar1;
  bool bVar2;
  Json json;
  string local_118;
  string local_f8;
  Json local_d8;
  
  if ((*args->arg_type == STRING_RESULT) && (args->arg_type[1] == STRING_RESULT)) {
    pcVar1 = *args->args;
    if ((pcVar1 != (char *)0x0) && (args->args[1] != (char *)0x0)) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,pcVar1,pcVar1 + *args->lengths);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,args->args[1],args->args[1] + args->lengths[1]);
      Json::Json(&local_d8,&local_118,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      bVar2 = Json::IsValid(&local_d8);
      if (bVar2) {
        Json::Str_abi_cxx11_(&local_118,&local_d8);
        std::__cxx11::string::~string((string *)&local_118);
        if (local_118._M_string_length < 0x100) {
          Json::Str_abi_cxx11_(&local_118,&local_d8);
          strncpy(result,local_118._M_dataplus._M_p,local_118._M_string_length);
          std::__cxx11::string::~string((string *)&local_118);
          *length = local_118._M_string_length;
        }
        else {
          pcVar1 = initid->ptr;
          Json::Str_abi_cxx11_(&local_118,&local_d8);
          strncpy(pcVar1,local_118._M_dataplus._M_p,local_118._M_string_length);
          std::__cxx11::string::~string((string *)&local_118);
          initid->ptr[local_118._M_string_length - 1] = '\0';
          result = initid->ptr;
        }
      }
      else {
        result = (char *)0x0;
      }
      Json::~Json(&local_d8);
      return result;
    }
  }
  return (char *)0x0;
}

Assistant:

char* udf_json_get_value(UDF_INIT* initid, UDF_ARGS* args, char* result, unsigned long* length, char* is_null, char *error)
{
    if (args->arg_type[0] != STRING_RESULT
        || args->arg_type[1] != STRING_RESULT
        || args->args[0] == NULL
        || args->args[1] == NULL    )
    {
        return NULL;
    }

    Json json(std::string(args->args[0], args->lengths[0]), std::string(args->args[1], args->lengths[1]));
    if (!json.IsValid()) {
        return NULL;
    }
    size_t len = json.Str().size();
    if (len < 256) {
        strncpy(result, json.Str().c_str(), len);
        *length = len;
        return result;
    } else {
        strncpy(initid->ptr, json.Str().c_str(), len);
        initid->ptr[len - 1] = 0;
        return initid->ptr;
    }
}